

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzfmatrix.cpp
# Opt level: O1

void __thiscall TPZFMatrix<long>::Write(TPZFMatrix<long> *this,TPZStream *buf,int withclassid)

{
  TPZBaseMatrix::Write((TPZBaseMatrix *)this,buf,withclassid);
  (*buf->_vptr_TPZStream[5])
            (buf,this->fElem,
             (ulong)(uint)((int)(this->super_TPZMatrix<long>).super_TPZBaseMatrix.fCol *
                          (int)(this->super_TPZMatrix<long>).super_TPZBaseMatrix.fRow));
  return;
}

Assistant:

void TPZFMatrix<TVar>::Write( TPZStream &buf, int withclassid ) const { //ok
    if constexpr (std::is_same<TVar, TFad<6, REAL>>::value ||
                  std::is_same<TVar, Fad<float>>::value ||
                  std::is_same<TVar, Fad<double>>::value ||
                  std::is_same<TVar, Fad<long double>>::value||
                  std::is_same<TVar, TPZFlopCounter>::value) {
        PZError<<__PRETTY_FUNCTION__;
        PZError<<" not implemented for this type\n";
        PZError<<"Aborting...";
        DebugStop();
    }
    TPZMatrix<TVar>::Write(buf,withclassid);
    buf.Write(fElem,this->fRow*this->fCol);
}